

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O0

void __thiscall ViconCGStreamClientSDK::VCGClient::VCGClient(VCGClient *this)

{
  VCGClient *this_local;
  
  ICGClient::ICGClient(&this->super_ICGClient);
  (this->super_ICGClient)._vptr_ICGClient = (_func_int **)&PTR_Destroy_002a2cd8;
  std::
  vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
  ::vector(&this->m_pClients);
  std::
  vector<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>,_std::allocator<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>_>_>
  ::vector(&this->m_pCallbacks);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_LastFrameIDs);
  std::
  map<unsigned_long,_bool,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bool>_>_>
  ::map(&this->m_Connected);
  this->m_bMulticastReceiving = false;
  this->m_bMulticastController = false;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->m_HapticDeviceOnList);
  boost::recursive_mutex::recursive_mutex(&this->m_ClientMutex);
  ViconCGStream::VObjectEnums::VObjectEnums(&this->m_RequestedObjects);
  std::shared_ptr<const_VStaticObjects>::shared_ptr(&this->m_pLastStaticObjects);
  std::
  deque<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ::deque(&this->m_FrameDeque);
  this->m_MaxBufferSize = 1;
  boost::condition_variable_any::condition_variable_any(&this->m_NewFramesCondition);
  return;
}

Assistant:

VCGClient::VCGClient()
: m_bMulticastReceiving( false )
, m_bMulticastController( false )
, m_MaxBufferSize( 1 )
{
}